

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void send_ssi_file(mg_connection *nc,char *path,FILE *fp,int include_level,mg_serve_http_opts *opts)

{
  undefined1 *puVar1;
  long lVar2;
  mg_serve_http_opts *opts_00;
  int iVar3;
  long lVar4;
  FILE *__stream;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  int len;
  bool bVar8;
  char buf [8192];
  char file_name [8192];
  undefined1 auStack_4258 [12];
  int local_424c;
  mg_serve_http_opts *local_4248;
  char *local_4240;
  char local_4238 [510];
  char acStack_403a [2];
  int local_4038;
  char local_4034;
  undefined4 local_4033;
  undefined1 auStack_402f [4];
  undefined1 local_402b [8179];
  undefined1 local_2038 [8200];
  
  if (10 < include_level) {
    mg_printf(nc,"SSI #include level is too deep (%s)",path);
    return;
  }
  iVar3 = fgetc((FILE *)fp);
  if (iVar3 != -1) {
    local_424c = include_level + 1;
    bVar8 = false;
    len = 0;
    local_4248 = opts;
    local_4240 = path;
    do {
      if (iVar3 == 0x3e && bVar8) {
        lVar4 = (long)len;
        if ((*(char *)(lVar4 + -1 + (long)&local_4038) == '-') && (acStack_403a[lVar4] == '-')) {
          lVar4 = lVar4 + -2;
          do {
            *(undefined1 *)((long)&local_4038 + lVar4) = 0;
            if (lVar4 + -1 == 0) break;
            lVar2 = lVar4 + 1;
            lVar4 = lVar4 + -1;
          } while (acStack_403a[lVar2] == ' ');
          if (CONCAT31(auStack_402f._0_3_,local_4033._3_1_) == 0x6564756c &&
              local_4033 == 0x6c636e69) {
            iVar3 = __isoc99_sscanf(local_402b," virtual=\"%[^\"]\"",local_2038);
            if (iVar3 == 1) {
              snprintf(local_4238,500,"%s/%s",local_4248->document_root,local_2038);
            }
            else {
              iVar3 = __isoc99_sscanf(local_402b," abspath=\"%[^\"]\"",local_2038);
              if (iVar3 == 1) {
                sVar5 = 500;
                puVar1 = auStack_4258;
              }
              else {
                iVar3 = __isoc99_sscanf(local_402b," file=\"%[^\"]\"",local_2038);
                if ((iVar3 != 1) &&
                   (iVar3 = __isoc99_sscanf(local_402b," \"%[^\"]\"",local_2038), iVar3 != 1)) {
                  mg_printf(nc,"Bad SSI #include: [%s]",local_402b);
                  goto LAB_001137d2;
                }
                snprintf(local_4238,500,"%s",local_4240);
                pcVar7 = strrchr(local_4238,0x2f);
                if (pcVar7 != (char *)0x0) {
                  pcVar7[1] = '\0';
                }
                sVar5 = strlen(local_4238);
                puVar1 = auStack_4258 + sVar5;
                sVar5 = 500 - sVar5;
              }
              snprintf(puVar1 + 0x20,sVar5,"%s",local_2038);
            }
            __stream = fopen64(local_4238,"rb");
            if (__stream == (FILE *)0x0) {
              piVar6 = __errno_location();
              pcVar7 = strerror(*piVar6);
              mg_printf(nc,"SSI include error: fopen(%s): %s",local_4238,pcVar7);
            }
            else {
              iVar3 = fileno(__stream);
              fcntl64(iVar3,2,1);
              opts_00 = local_4248;
              pcVar7 = local_4248->ssi_pattern;
              sVar5 = strlen(pcVar7);
              iVar3 = mg_match_prefix(pcVar7,(int)sVar5,local_4238);
              if (iVar3 < 1) {
                send_file_data(nc,(FILE *)__stream);
              }
              else {
                send_ssi_file(nc,local_4238,(FILE *)__stream,local_424c,opts_00);
              }
              fclose(__stream);
            }
          }
          else if (local_4033 == 0x6c6c6163) {
            mg_call(nc,(mg_event_handler_t)0x0,0x69,auStack_402f + 1);
          }
          else if (local_4033 == 0x63657865) {
            do_ssi_exec(nc,auStack_402f + 1);
          }
LAB_001137d2:
          len = 0;
          bVar8 = false;
        }
        else {
LAB_00113566:
          bVar8 = true;
          if (len == 0x1ffe) {
            len = 0;
            mg_printf(nc,"%s: SSI tag is too large",local_4240);
          }
          else if (len == 5) {
            bVar8 = local_4034 == '#' && local_4038 == 0x2d2d213c;
            len = 5;
          }
          lVar4 = (long)len;
          len = len + 1;
          *(char *)((long)&local_4038 + lVar4) = (char)iVar3;
        }
      }
      else if (iVar3 == 0x3c) {
        if (0 < len) {
          mg_send(nc,&local_4038,len);
        }
        local_4038 = CONCAT31(local_4038._1_3_,0x3c);
        len = 1;
        bVar8 = true;
      }
      else {
        if (bVar8) goto LAB_00113566;
        lVar4 = (long)len;
        len = len + 1;
        *(char *)((long)&local_4038 + lVar4) = (char)iVar3;
        bVar8 = false;
        if (len == 0x2000) {
          mg_send(nc,&local_4038,0x2000);
          goto LAB_001137d2;
        }
      }
      iVar3 = fgetc((FILE *)fp);
    } while (iVar3 != -1);
    if (0 < len) {
      mg_send(nc,&local_4038,len);
    }
  }
  return;
}

Assistant:

static void send_ssi_file(struct mg_connection *nc, const char *path, FILE *fp,
                          int include_level,
                          const struct mg_serve_http_opts *opts) {
    static const struct mg_str btag = MG_STR("<!--#");
    static const struct mg_str d_include = MG_STR("include");
    static const struct mg_str d_call = MG_STR("call");
#ifndef MG_DISABLE_POPEN
    static const struct mg_str d_exec = MG_STR("exec");
#endif
    char buf[BUFSIZ], *p = buf + btag.len; /* p points to SSI directive */
    int ch, offset, len, in_ssi_tag;

    if (include_level > 10) {
        mg_printf(nc, "SSI #include level is too deep (%s)", path);
        return;
    }

    in_ssi_tag = len = offset = 0;
    while ((ch = fgetc(fp)) != EOF) {
        if (in_ssi_tag && ch == '>' && buf[len - 1] == '-' && buf[len - 2] == '-') {
            size_t i = len - 2;
            in_ssi_tag = 0;

            /* Trim closing --> */
            buf[i--] = '\0';
            while (i > 0 && buf[i] == ' ') {
                buf[i--] = '\0';
            }

            /* Handle known SSI directives */
            if (memcmp(p, d_include.p, d_include.len) == 0) {
                do_ssi_include(nc, path, p + d_include.len + 1, include_level, opts);
            } else if (memcmp(p, d_call.p, d_call.len) == 0) {
                do_ssi_call(nc, p + d_call.len + 1);
#ifndef MG_DISABLE_POPEN
            } else if (memcmp(p, d_exec.p, d_exec.len) == 0) {
                do_ssi_exec(nc, p + d_exec.len + 1);
#endif
            } else {
                /* Silently ignore unknown SSI directive. */
            }
            len = 0;
        } else if (ch == '<') {
            in_ssi_tag = 1;
            if (len > 0) {
                mg_send(nc, buf, (size_t) len);
            }
            len = 0;
            buf[len++] = ch & 0xff;
        } else if (in_ssi_tag) {
            if (len == (int) btag.len && memcmp(buf, btag.p, btag.len) != 0) {
                /* Not an SSI tag */
                in_ssi_tag = 0;
            } else if (len == (int) sizeof(buf) - 2) {
                mg_printf(nc, "%s: SSI tag is too large", path);
                len = 0;
            }
            buf[len++] = ch & 0xff;
        } else {
            buf[len++] = ch & 0xff;
            if (len == (int) sizeof(buf)) {
                mg_send(nc, buf, (size_t) len);
                len = 0;
            }
        }
    }

    /* Send the rest of buffered data */
    if (len > 0) {
        mg_send(nc, buf, (size_t) len);
    }
}